

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

char * __thiscall Json::Value::asCString(Value *this)

{
  runtime_error *this_00;
  Value *this_local;
  
  if ((*(ushort *)&this->field_0x8 & 0xff) != 4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"in Json::Value::asCString(): requires stringValue");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (char *)(this->value_).int_;
}

Assistant:

const char* Value::asCString() const {
  JSON_ASSERT_MESSAGE(type_ == stringValue,
                      "in Json::Value::asCString(): requires stringValue");
  return value_.string_;
}